

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgtextelement.cpp
# Opt level: O1

float __thiscall
lunasvg::SVGTextPositioningElement::convertBaselineOffset
          (SVGTextPositioningElement *this,BaselineShift *baselineShift)

{
  LengthUnits LVar1;
  Type TVar2;
  float fVar3;
  
  TVar2 = baselineShift->m_type;
  if (TVar2 == Baseline) {
    return 0.0;
  }
  if (TVar2 == Super) {
    fVar3 = Font::height(&this->m_font);
  }
  else {
    if (TVar2 == Sub) {
      fVar3 = Font::height(&this->m_font);
      return fVar3 * -0.5;
    }
    LVar1 = (baselineShift->m_length).m_units;
    fVar3 = (baselineShift->m_length).m_value;
    if (LVar1 != Ex) {
      if (LVar1 == Em) {
        return fVar3 * (this->m_font).m_size;
      }
      if (LVar1 != Percent) {
        return fVar3;
      }
      return (fVar3 * (this->m_font).m_size) / 100.0;
    }
    fVar3 = fVar3 * (this->m_font).m_size;
  }
  return fVar3 * 0.5;
}

Assistant:

float SVGTextPositioningElement::convertBaselineOffset(const BaselineShift& baselineShift) const
{
    if(baselineShift.type() == BaselineShift::Type::Baseline)
        return 0.f;
    if(baselineShift.type() == BaselineShift::Type::Sub)
        return -m_font.height() / 2.f;
    if(baselineShift.type() == BaselineShift::Type::Super) {
        return m_font.height() / 2.f;
    }

    const auto& length = baselineShift.length();
    if(length.units() == LengthUnits::Percent)
        return length.value() * m_font.size() / 100.f;
    if(length.units() == LengthUnits::Ex)
        return length.value() * m_font.size() / 2.f;
    if(length.units() == LengthUnits::Em)
        return length.value() * m_font.size();
    return length.value();
}